

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O2

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::calcDeadReckoningFPW
          (DeadReckoningCalculator *this,WorldCoordinates *PositionOut,KFLOAT32 totalTimeSinceReset)

{
  Vector local_50;
  WorldCoordinates local_38;
  
  DATA_TYPE::Vector::operator*(&local_50,&this->m_initLinearVelocity,totalTimeSinceReset);
  DATA_TYPE::WorldCoordinates::operator+(&local_38,&this->m_initPosition,&local_50);
  PositionOut->m_f64Z = local_38.m_f64Z;
  PositionOut->m_f64X = local_38.m_f64X;
  PositionOut->m_f64Y = local_38.m_f64Y;
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_38.super_DataTypeBase);
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_50.super_DataTypeBase);
  return;
}

Assistant:

void DeadReckoningCalculator::calcDeadReckoningFPW( WorldCoordinates & PositionOut, const KFLOAT32 totalTimeSinceReset)
{
    /* Position */
    PositionOut = ( m_initPosition + ( m_initLinearVelocity * totalTimeSinceReset ) );
}